

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall toml::detail::region::region(region *this,region *param_1)

{
  region *param_1_local;
  region *this_local;
  
  region_base::region_base(&this->super_region_base,&param_1->super_region_base);
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__region_00436d88;
  std::shared_ptr<const_std::vector<char,_std::allocator<char>_>_>::shared_ptr
            (&this->source_,&param_1->source_);
  std::__cxx11::string::string((string *)&this->source_name_,(string *)&param_1->source_name_);
  (this->first_)._M_current = (param_1->first_)._M_current;
  (this->last_)._M_current = (param_1->last_)._M_current;
  return;
}

Assistant:

region(region&&)      = default;